

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O2

string * __thiscall
duckdb::StringStatisticsState::TruncateMin_abi_cxx11_
          (string *__return_storage_ptr__,StringStatisticsState *this,string_t str,idx_t max_size)

{
  long lVar1;
  undefined8 local_18;
  long local_10;
  
  local_10 = str.value._8_8_;
  local_18 = str.value._0_8_;
  lVar1 = local_10;
  if (str.value._0_4_ < 0xd) {
    lVar1 = (long)&local_18 + 4;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar1,max_size + lVar1);
  return __return_storage_ptr__;
}

Assistant:

string TruncateMin(string_t str, idx_t max_size) {
		// truncate a string for the min value
		// since 'AAA' < 'AAAA', we can just truncate the string
		D_ASSERT(str.GetSize() > max_size);
		if (type == LogicalTypeId::BLOB) {
			// for blobs - just truncate directly
			return string(str.GetData(), max_size);
		}
		D_ASSERT(type == LogicalTypeId::VARCHAR);
		// for varchar we need to truncate to a valid UTF8 string - so we need to truncate to the last valid UTF8 byte
		auto str_data = str.GetData();
		for (; max_size > 0; max_size--) {
			if (IsCharacter(str_data[max_size])) {
				break;
			}
		}
		return string(str_data, max_size);
	}